

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O0

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::HandleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_6)

{
  Argument1 gmock_a1;
  Argument1 gmock_a1_00;
  Argument1 gmock_a1_01;
  Argument1 gmock_a1_02;
  bool bVar1;
  Result RVar2;
  Result RVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  long in_RCX;
  long in_RDI;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dir;
  size_t pos;
  string solFilePath;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  Kind kindO;
  Kind kindP;
  char *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  SolFileWriter *in_stack_fffffffffffffd28;
  CStringRef in_stack_fffffffffffffd30;
  MockProblemBuilder *in_stack_fffffffffffffd38;
  ArrayRef<long> *in_stack_fffffffffffffd40;
  size_t in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Result in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd60;
  ArrayRef<double> *dual_values_00;
  int on;
  string local_248 [32];
  string local_228 [38];
  byte local_202;
  allocator<char> local_201;
  string local_200 [32];
  long local_1e0;
  string local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [9];
  undefined4 local_84 [6];
  undefined4 local_6c [6];
  undefined4 local_54 [6];
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  char *local_28;
  long local_20;
  BasicCStringRef<char> local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  bVar1 = BasicSolver::need_multiple_solutions
                    ((BasicSolver *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  if ((bVar1) && (local_20 != 0)) {
    local_34 = 0x53;
    local_38 = 0x52;
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
               ,in_stack_fffffffffffffd18);
    gmock_a1.size_ = in_stack_fffffffffffffd48;
    gmock_a1.data_ = (char *)in_stack_fffffffffffffd40;
    local_3c = MockProblemBuilder::AddIntSuffix
                         (in_stack_fffffffffffffd38,gmock_a1,
                          (Argument2_conflict)((ulong)in_stack_fffffffffffffd30.data_ >> 0x20),
                          (Argument3)in_stack_fffffffffffffd30.data_);
    TestSuffixHandler<0>::SetValue((TestSuffixHandler<0> *)&local_3c,0,*(int *)(in_RDI + 0x80));
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
               ,in_stack_fffffffffffffd18);
    gmock_a1_00.size_ = in_stack_fffffffffffffd48;
    gmock_a1_00.data_ = (char *)in_stack_fffffffffffffd40;
    local_54[0] = MockProblemBuilder::AddIntSuffix
                            (in_stack_fffffffffffffd38,gmock_a1_00,
                             (Argument2_conflict)((ulong)in_stack_fffffffffffffd30.data_ >> 0x20),
                             (Argument3)in_stack_fffffffffffffd30.data_);
    TestSuffixHandler<0>::SetValue((TestSuffixHandler<0> *)local_54,0,*(int *)(in_RDI + 0x80));
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
               ,in_stack_fffffffffffffd18);
    gmock_a1_01.size_ = in_stack_fffffffffffffd48;
    gmock_a1_01.data_ = (char *)in_stack_fffffffffffffd40;
    local_6c[0] = MockProblemBuilder::AddIntSuffix
                            (in_stack_fffffffffffffd38,gmock_a1_01,
                             (Argument2_conflict)((ulong)in_stack_fffffffffffffd30.data_ >> 0x20),
                             (Argument3)in_stack_fffffffffffffd30.data_);
    TestSuffixHandler<0>::SetValue((TestSuffixHandler<0> *)local_6c,0,*(int *)(in_RDI + 0x80));
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
               ,in_stack_fffffffffffffd18);
    gmock_a1_02.size_ = in_stack_fffffffffffffd48;
    gmock_a1_02.data_ = (char *)in_stack_fffffffffffffd40;
    local_84[0] = MockProblemBuilder::AddIntSuffix
                            (in_stack_fffffffffffffd38,gmock_a1_02,
                             (Argument2_conflict)((ulong)in_stack_fffffffffffffd30.data_ >> 0x20),
                             (Argument3)in_stack_fffffffffffffd30.data_);
    TestSuffixHandler<0>::SetValue((TestSuffixHandler<0> *)local_84,0,*(int *)(in_RDI + 0x80));
  }
  dual_values_00 = *(ArrayRef<double> **)(in_RDI + 0x50);
  pcVar5 = fmt::BasicCStringRef<char>::c_str(&local_8);
  on = (int)pcVar5;
  ArrayRef<long>::ArrayRef(in_stack_fffffffffffffd40,(ArrayRef<long> *)in_stack_fffffffffffffd38);
  if (local_20 == 0) {
    RVar2 = 0;
  }
  else {
    RVar2 = MockProblemBuilder::num_vars
                      ((MockProblemBuilder *)
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  }
  MakeArrayRef<double>
            ((double *)in_stack_fffffffffffffd28,
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  if (local_28 == (char *)0x0) {
    RVar3 = 0;
    pcVar5 = local_28;
  }
  else {
    RVar3 = MockProblemBuilder::num_algebraic_cons
                      ((MockProblemBuilder *)
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    in_stack_fffffffffffffd54 = RVar3;
    pcVar5 = local_28;
  }
  s = local_1b8;
  MakeArrayRef<double>
            ((double *)in_stack_fffffffffffffd28,
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  iVar4 = BasicSolver::objno_used
                    ((BasicSolver *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  __lhs = s;
  SolutionAdapter<StrictMockProblemBuilder>::SolutionAdapter
            ((SolutionAdapter<StrictMockProblemBuilder> *)CONCAT44(RVar2,in_stack_fffffffffffffd60),
             (int)((ulong)pcVar5 >> 0x20),
             (StrictMockProblemBuilder *)CONCAT44(in_stack_fffffffffffffd54,RVar3),(char *)s,
             in_stack_fffffffffffffd40,(ArrayRef<double> *)in_stack_fffffffffffffd38,dual_values_00,
             on);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x22a78b);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x22a798);
  ArrayRef<long>::~ArrayRef((ArrayRef<long> *)0x22a7a5);
  std::__cxx11::string::string(local_1d8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    uVar6 = std::__cxx11::string::length();
    if ((uVar6 < 2) ||
       ((in_stack_fffffffffffffd40 =
              (ArrayRef<long> *)std::__cxx11::string::operator[](in_RDI + 0x28),
        *(char *)&(in_stack_fffffffffffffd40->save_).super__Vector_base<long,_std::allocator<long>_>
                  ._M_impl.super__Vector_impl_data._M_start != '/' &&
        (pcVar7 = (char *)std::__cxx11::string::operator[](in_RDI + 0x28), *pcVar7 != ':')))) {
      local_1e0 = std::__cxx11::string::find_last_of((char *)(in_RDI + 8),0x2ee52e);
      local_202 = 0;
      if (local_1e0 == -1) {
        in_stack_fffffffffffffd30.data_ = (char *)&local_201;
        std::allocator<char>::allocator();
        local_202 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(RVar2,in_stack_fffffffffffffd60),pcVar5,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,RVar3));
      }
      else {
        std::__cxx11::string::substr((ulong)local_200,in_RDI + 8);
      }
      if ((local_202 & 1) != 0) {
        std::allocator<char>::~allocator(&local_201);
      }
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd40);
      std::__cxx11::string::operator=(local_1d8,local_228);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_200);
    }
    else {
      std::__cxx11::string::operator=(local_1d8,(string *)(in_RDI + 0x28));
    }
  }
  else {
    std::operator+(__lhs,(char *)in_stack_fffffffffffffd40);
    std::__cxx11::string::operator=(local_1d8,local_248);
    std::__cxx11::string::~string(local_248);
  }
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)CONCAT44(in_stack_fffffffffffffd24,iVar4),s);
  SolFileWriter::Write<mp::SolutionAdapter<StrictMockProblemBuilder>>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
             (SolutionAdapter<StrictMockProblemBuilder> *)CONCAT44(in_stack_fffffffffffffd24,iVar4))
  ;
  std::__cxx11::string::~string(local_1d8);
  SolutionAdapter<StrictMockProblemBuilder>::~SolutionAdapter
            ((SolutionAdapter<StrictMockProblemBuilder> *)CONCAT44(in_stack_fffffffffffffd24,iVar4))
  ;
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
	if (solver_.need_multiple_solutions()
			&& values) {             // not when reporting an error
    auto kindP = mp::suf::Kind( suf::PROBLEM | suf::OUTPUT | suf::OUTONLY );
    auto kindO = mp::suf::Kind( suf::OBJ | suf::OUTPUT | suf::OUTONLY );
    builder_.AddIntSuffix("nsol", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("nsol", kindO, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindO, 0).
        SetValue(0, num_solutions_);
  }
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());

  std::string solFilePath;
  if (!overrideStub_.empty()) { 
    // Check if its absolute or relative
    if ((overrideStub_.length() >= 2) &&// cannot be absolute otherwise 
       ((overrideStub_[0] == '/') || // linux abs (/ ...)
        (overrideStub_[1] == ':') ))  {// windows abs (x: ///)
        solFilePath = overrideStub_; // if absolute
    }
    else { // if relative
      size_t pos = stub_.find_last_of("\\/"); //.find parent dir
      auto dir = (std::string::npos == pos) ? "" : stub_.substr(0, pos+1);
      solFilePath = dir + overrideStub_;
    }
  }
  else { solFilePath = stub_ + ".sol"; }
  
  this->Write(solFilePath, sol);
}